

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O3

void __thiscall
amrex::MLCellLinOp::interpolation
          (MLCellLinOp *this,int amrlev,int fmglev,MultiFab *fine,MultiFab *crse)

{
  pointer pIVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  bool bVar15;
  MFIter mfi;
  ulong local_1d8;
  Box local_12c;
  Array4<double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  uVar2 = (*(this->super_MLLinOp)._vptr_MLLinOp[5])();
  iVar7 = 2;
  iVar8 = 2;
  iVar14 = 2;
  if (amrlev < 1) {
    pIVar1 = (this->super_MLLinOp).mg_coarsen_ratio_vec.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar14 = pIVar1[fmglev].vect[0];
    iVar8 = pIVar1[fmglev].vect[1];
    iVar7 = pIVar1[fmglev].vect[2];
  }
  MFIter::MFIter(&local_90,(FabArrayBase *)fine,true);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      MFIter::tilebox(&local_12c,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_d0,&crse->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_110,&fine->super_FabArray<amrex::FArrayBox>,&local_90);
      if (0 < (int)uVar2) {
        local_1d8 = 0;
        do {
          uVar5 = local_12c.smallend.vect[2];
          if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
            do {
              if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
                lVar6 = ((long)(int)uVar5 - (long)local_110.begin.z) * local_110.kstride;
                uVar10 = (long)local_12c.smallend.vect[1];
                do {
                  if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                    uVar9 = (uint)uVar10;
                    lVar4 = (uVar10 - (long)local_110.begin.y) * local_110.jstride;
                    uVar11 = (long)local_12c.smallend.vect[0];
                    do {
                      uVar12 = (uint)uVar11;
                      if (iVar14 != 1) {
                        if (iVar14 == 4) {
                          if ((long)uVar11 < 0) {
                            uVar12 = (int)uVar12 >> 2;
                          }
                          else {
                            uVar12 = uVar12 >> 2;
                          }
                        }
                        else if (iVar14 == 2) {
                          if ((long)uVar11 < 0) {
                            uVar12 = (int)uVar12 >> 1;
                          }
                          else {
                            uVar12 = uVar12 >> 1;
                          }
                        }
                        else if ((long)uVar11 < 0) {
                          uVar12 = ~((int)~uVar12 / iVar14);
                        }
                        else {
                          uVar12 = (uint)((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 |
                                                uVar11 & 0xffffffff) / (long)iVar14);
                        }
                      }
                      uVar13 = uVar9;
                      if (((iVar8 != 1) && (uVar13 = (int)uVar9 >> 2, iVar8 != 4)) &&
                         (uVar13 = (int)uVar9 >> 1, iVar8 != 2)) {
                        if ((long)uVar10 < 0) {
                          uVar13 = ~((int)~uVar9 / iVar8);
                        }
                        else {
                          uVar13 = (uint)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 |
                                                uVar10 & 0xffffffff) / (long)iVar8);
                        }
                      }
                      uVar3 = uVar5;
                      if (((iVar7 != 1) && (uVar3 = (int)uVar5 >> 2, iVar7 != 4)) &&
                         (uVar3 = (int)uVar5 >> 1, iVar7 != 2)) {
                        if ((int)uVar5 < 0) {
                          uVar3 = ~((int)~uVar5 / iVar7);
                        }
                        else {
                          uVar3 = (int)uVar5 / iVar7;
                        }
                      }
                      local_110.p
                      [lVar6 + local_110.nstride * local_1d8 +
                               lVar4 + (uVar11 - (long)local_110.begin.x)] =
                           local_d0.p
                           [((long)(int)uVar13 - (long)local_d0.begin.y) * local_d0.jstride +
                            ((long)(int)uVar12 - (long)local_d0.begin.x) +
                            ((long)(int)uVar3 - (long)local_d0.begin.z) * local_d0.kstride +
                            local_d0.nstride * local_1d8] +
                           local_110.p
                           [lVar6 + local_110.nstride * local_1d8 +
                                    lVar4 + (uVar11 - (long)local_110.begin.x)];
                      uVar11 = uVar11 + 1;
                    } while ((int)uVar11 != local_12c.bigend.vect[0] + 1);
                  }
                  uVar10 = uVar10 + 1;
                } while (local_12c.bigend.vect[1] + 1 != (int)uVar10);
              }
              bVar15 = uVar5 != local_12c.bigend.vect[2];
              uVar5 = uVar5 + 1;
            } while (bVar15);
          }
          local_1d8 = local_1d8 + 1;
        } while (local_1d8 != uVar2);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MLCellLinOp::interpolation (int amrlev, int fmglev, MultiFab& fine, const MultiFab& crse) const
{
#ifdef AMREX_SOFT_PERF_COUNTERS
    perf_counters.interpolate(fine);
#endif

    const int ncomp = getNComp();

    Dim3 ratio3 = {2,2,2};
    IntVect ratio = (amrlev > 0) ? IntVect(2) : mg_coarsen_ratio_vec[fmglev];
    AMREX_D_TERM(ratio3.x = ratio[0];,
                 ratio3.y = ratio[1];,
                 ratio3.z = ratio[2];);

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && fine.isFusingCandidate()) {
        auto const& finema = fine.arrays();
        auto const& crsema = crse.const_arrays();
        ParallelFor(fine, IntVect(0), ncomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            int ic = amrex::coarsen(i,ratio3.x);
            int jc = amrex::coarsen(j,ratio3.y);
            int kc = amrex::coarsen(k,ratio3.z);
            finema[box_no](i,j,k,n) += crsema[box_no](ic,jc,kc,n);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(fine,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx    = mfi.tilebox();
            Array4<Real const> const& cfab = crse.const_array(mfi);
            Array4<Real> const& ffab = fine.array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                int ic = amrex::coarsen(i,ratio3.x);
                int jc = amrex::coarsen(j,ratio3.y);
                int kc = amrex::coarsen(k,ratio3.z);
                ffab(i,j,k,n) += cfab(ic,jc,kc,n);
            });
        }
    }
}